

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdom.cpp
# Opt level: O3

QDomElement __thiscall
QDomNode::previousSiblingElement(QDomNode *this,QString *tagName,QString *namespaceURI)

{
  QAtomicInt *pQVar1;
  Data *pDVar2;
  QDomNodePrivate *pQVar3;
  char cVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  long in_RCX;
  storage_type_conflict *psVar8;
  char16_t *pcVar9;
  qsizetype qVar10;
  QArrayData *pQVar11;
  long in_FS_OFFSET;
  QStringView QVar12;
  QStringView QVar13;
  QStringView QVar14;
  QStringView QVar15;
  QDomNode sib;
  QDomNode local_48;
  QDomNode local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_40.impl = (QDomNodePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  pDVar2 = (tagName->d).d;
  if (pDVar2 == (Data *)0x0) {
    QDomNode(&local_40);
  }
  else {
    QDomNode(&local_40,*(QDomNodePrivate **)&pDVar2[1].super_QArrayData);
  }
  do {
    if ((QDomElementPrivate *)local_40.impl == (QDomElementPrivate *)0x0) {
      QDomDocument::~QDomDocument((QDomDocument *)&local_40);
      QDomElement::QDomElement((QDomElement *)this);
LAB_001100f2:
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
        __stack_chk_fail();
      }
      return (QDomElement)(QDomNode)this;
    }
    iVar5 = (*((QDomNodePrivate *)&(local_40.impl)->_vptr_QDomNodePrivate)->_vptr_QDomNodePrivate
              [0xb])();
    if (iVar5 == 1) {
      lVar7 = *(long *)(in_RCX + 0x10);
      if (lVar7 != 0) {
        if ((QDomElementPrivate *)local_40.impl == (QDomElementPrivate *)0x0) {
          pQVar11 = (QArrayData *)0x0;
          psVar8 = (storage_type_conflict *)0x0;
          lVar6 = 0;
        }
        else {
          pQVar11 = &(((local_40.impl)->namespaceURI).d.d)->super_QArrayData;
          psVar8 = ((local_40.impl)->namespaceURI).d.ptr;
          lVar6 = ((local_40.impl)->namespaceURI).d.size;
          if (pQVar11 == (QArrayData *)0x0) {
            pQVar11 = (QArrayData *)0x0;
          }
          else {
            LOCK();
            (pQVar11->ref_)._q_value.super___atomic_base<int>._M_i =
                 (pQVar11->ref_)._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
            lVar7 = *(long *)(in_RCX + 0x10);
          }
        }
        if (lVar6 == lVar7) {
          QVar12.m_data = psVar8;
          QVar12.m_size = lVar7;
          QVar14.m_data = *(storage_type_conflict **)(in_RCX + 8);
          QVar14.m_size = lVar7;
          cVar4 = QtPrivate::equalStrings(QVar12,QVar14);
        }
        else {
          cVar4 = '\0';
        }
        if (pQVar11 != (QArrayData *)0x0) {
          LOCK();
          (pQVar11->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar11->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQVar11->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQVar11,2,0x10);
          }
        }
        if (cVar4 == '\0') goto LAB_00110068;
      }
      this->impl = (QDomNodePrivate *)&DAT_aaaaaaaaaaaaaaaa;
      if (((QDomElementPrivate *)local_40.impl == (QDomElementPrivate *)0x0) ||
         (iVar5 = (*((QDomNodePrivate *)&(local_40.impl)->_vptr_QDomNodePrivate)->
                    _vptr_QDomNodePrivate[0xb])(), iVar5 != 1)) {
        QDomElement::QDomElement((QDomElement *)this);
      }
      else {
        QDomElement::QDomElement((QDomElement *)this,(QDomElementPrivate *)local_40.impl);
      }
      qVar10 = (namespaceURI->d).size;
      if (qVar10 != 0) {
        pQVar3 = this->impl;
        if (pQVar3 == (QDomNodePrivate *)0x0) {
          pQVar11 = (QArrayData *)0x0;
          pcVar9 = (char16_t *)0x0;
          lVar7 = 0;
        }
        else {
          pQVar11 = &((pQVar3->name).d.d)->super_QArrayData;
          pcVar9 = (pQVar3->name).d.ptr;
          lVar7 = (pQVar3->name).d.size;
          if (pQVar11 == (QArrayData *)0x0) {
            pQVar11 = (QArrayData *)0x0;
          }
          else {
            LOCK();
            (((QArrayData *)&pQVar11->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
                 (((QArrayData *)&pQVar11->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
            qVar10 = (namespaceURI->d).size;
          }
        }
        if (lVar7 == qVar10) {
          QVar13.m_data = pcVar9;
          QVar13.m_size = qVar10;
          QVar15.m_data = (namespaceURI->d).ptr;
          QVar15.m_size = qVar10;
          cVar4 = QtPrivate::equalStrings(QVar13,QVar15);
        }
        else {
          cVar4 = '\0';
        }
        if (pQVar11 != (QArrayData *)0x0) {
          LOCK();
          (pQVar11->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar11->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQVar11->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQVar11,2,0x10);
          }
        }
        if (cVar4 == '\0') {
          if (this->impl != (QDomNodePrivate *)0x0) {
            LOCK();
            pQVar1 = &this->impl->ref;
            (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
            super___atomic_base<int>._M_i =
                 (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
                 super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
                 super___atomic_base<int>._M_i == 0) && (this->impl != (QDomNodePrivate *)0x0)) {
              (*this->impl->_vptr_QDomNodePrivate[1])();
            }
          }
          goto LAB_00110068;
        }
      }
      QDomDocument::~QDomDocument((QDomDocument *)&local_40);
      goto LAB_001100f2;
    }
LAB_00110068:
    if ((QDomElementPrivate *)local_40.impl == (QDomElementPrivate *)0x0) {
      QDomNode(&local_48);
    }
    else {
      QDomNode(&local_48,(local_40.impl)->prev);
    }
    if ((QDomElementPrivate *)local_48.impl != (QDomElementPrivate *)0x0) {
      LOCK();
      ((local_48.impl)->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           ((local_48.impl)->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if ((QDomElementPrivate *)local_40.impl != (QDomElementPrivate *)0x0) {
      LOCK();
      pQVar1 = &(local_40.impl)->ref;
      (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i == 0) &&
         ((QDomElementPrivate *)local_40.impl != (QDomElementPrivate *)0x0)) {
        (*((QDomNodePrivate *)&(local_40.impl)->_vptr_QDomNodePrivate)->_vptr_QDomNodePrivate[1])();
      }
    }
    local_40.impl = local_48.impl;
    QDomDocument::~QDomDocument((QDomDocument *)&local_48);
  } while( true );
}

Assistant:

QDomElement QDomNode::previousSiblingElement(const QString &tagName, const QString &namespaceURI) const
{
    for (QDomNode sib = previousSibling(); !sib.isNull(); sib = sib.previousSibling()) {
        if (sib.isElement() && (namespaceURI.isEmpty() || sib.namespaceURI() == namespaceURI)) {
            QDomElement elt = sib.toElement();
            if (tagName.isEmpty() || elt.tagName() == tagName)
                return elt;
        }
    }
    return QDomElement();
}